

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall
QListWidgetPrivate::emitCurrentItemChanged
          (QListWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QListWidget *this_00;
  char cVar1;
  int iVar2;
  QListModel *pQVar3;
  QListWidgetItem *_t2;
  QListWidgetItem *_t1;
  long in_FS_OFFSET;
  QPersistentModelIndex persistentCurrent;
  QArrayDataPointer<char16_t> local_58;
  QPersistentModelIndex local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidget **)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_38.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_38,current);
  pQVar3 = listModel(this);
  iVar2 = QPersistentModelIndex::row();
  if ((ulong)(long)iVar2 < (ulong)(pQVar3->items).d.size) {
    _t1 = (pQVar3->items).d.ptr[iVar2];
  }
  else {
    _t1 = (QListWidgetItem *)0x0;
  }
  pQVar3 = listModel(this);
  if ((ulong)(long)previous->r < (ulong)(pQVar3->items).d.size) {
    _t2 = (pQVar3->items).d.ptr[previous->r];
  }
  else {
    _t2 = (QListWidgetItem *)0x0;
  }
  QListWidget::currentItemChanged(this_00,_t1,_t2);
  cVar1 = QPersistentModelIndex::isValid();
  if ((cVar1 == '\0') || (_t1 == (QListWidgetItem *)0x0)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
  }
  else {
    QListWidgetItem::text((QString *)&local_58,_t1);
  }
  QListWidget::currentTextChanged(this_00,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  iVar2 = QPersistentModelIndex::row();
  QListWidget::currentRowChanged(this_00,iVar2);
  QPersistentModelIndex::~QPersistentModelIndex(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                const QModelIndex &previous)
{
    Q_Q(QListWidget);
    QPersistentModelIndex persistentCurrent = current;
    QListWidgetItem *currentItem = listModel()->at(persistentCurrent.row());
    emit q->currentItemChanged(currentItem, listModel()->at(previous.row()));

    //persistentCurrent is invalid if something changed the model in response
    //to the currentItemChanged signal emission and the item was removed
    if (!persistentCurrent.isValid()) {
        currentItem = nullptr;
    }

    emit q->currentTextChanged(currentItem ? currentItem->text() : QString());
    emit q->currentRowChanged(persistentCurrent.row());
}